

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckNameOfClass.cxx
# Opt level: O0

size_t __thiscall kws::Parser::GetClassPosition(Parser *this,size_t position,string *buffer)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  undefined1 *puVar6;
  string *in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar7;
  size_t sem;
  size_t brac;
  size_t i;
  bool valid;
  string nameOfClass;
  size_t pos;
  string *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff36;
  char in_stack_ffffffffffffff37;
  Parser *pPVar8;
  undefined1 *local_90;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  Parser *local_28;
  long local_18;
  undefined1 *local_8;
  
  local_18 = in_RSI;
  if (in_RSI == -1) {
    local_18 = 0;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=(in_RDX,(string *)(in_RDI + 0x518));
  }
  local_28 = (Parser *)std::__cxx11::string::find((char *)in_RDX,0x1e60e6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  do {
    if (local_28 == (Parser *)0xffffffffffffffff) {
      local_8 = (undefined1 *)0xffffffffffffffff;
LAB_001b18f9:
      std::__cxx11::string::~string(local_48);
      return (size_t)local_8;
    }
    pPVar8 = local_28;
    std::__cxx11::string::string(local_80,in_RDX);
    in_stack_ffffffffffffff37 =
         IsBetweenCharsFast(pPVar8,in_stack_ffffffffffffff37,in_stack_ffffffffffffff36,
                            (size_t)in_stack_ffffffffffffff28,
                            SUB81((ulong)in_stack_ffffffffffffff20 >> 0x38,0),
                            in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff36 = in_stack_ffffffffffffff37 ^ 0xff;
    std::__cxx11::string::~string(local_80);
    if ((in_stack_ffffffffffffff36 & 1) != 0) {
      bVar1 = true;
      if (((((Parser *)0x1 < local_28) &&
           (in_stack_ffffffffffffff28 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX),
           *in_stack_ffffffffffffff28 != ' ')) &&
          (in_stack_ffffffffffffff20 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX),
          *in_stack_ffffffffffffff20 != '/')) &&
         (in_stack_ffffffffffffff18 = (string *)std::__cxx11::string::operator[]((ulong)in_RDX),
         in_stack_ffffffffffffff18->_M_dataplus != (_Alloc_hider)0xa)) {
        bVar1 = false;
      }
      pPVar8 = local_28;
      lVar3 = std::__cxx11::string::size();
      if (((pPVar8 < (Parser *)(lVar3 - 2U)) &&
          (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX), *pcVar4 != ' ')) &&
         ((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX), *pcVar4 != '/' &&
          (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX), *pcVar4 != '\r')))) {
        bVar1 = false;
      }
      local_90 = (undefined1 *)
                 ((long)&(local_28->m_ErrorList).
                         super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                         _M_impl.super__Vector_impl_data._M_start + 4);
      uVar2 = std::__cxx11::string::find((char)in_RDX,0x7b);
      uVar5 = std::__cxx11::string::find((char)in_RDX,0x3b);
      if (uVar2 < uVar5) {
        while( true ) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
          bVar7 = false;
          if (*pcVar4 != '{') {
            puVar6 = (undefined1 *)std::__cxx11::string::size();
            bVar7 = local_90 < puVar6;
          }
          if (!bVar7) goto LAB_001b188c;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
          if (*pcVar4 == ';') break;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDX);
          if (*pcVar4 == ':') goto LAB_001b188c;
          local_90 = local_90 + 1;
        }
        bVar1 = false;
      }
      else {
        bVar1 = false;
      }
LAB_001b188c:
      if (bVar1) {
        local_8 = local_90;
        goto LAB_001b18f9;
      }
    }
    local_28 = (Parser *)std::__cxx11::string::find((char *)in_RDX,0x1e60e6);
  } while( true );
}

Assistant:

size_t Parser::GetClassPosition(size_t position,std::string buffer) const
{
  if(position == std::string::npos)
   {
   position = 0;
   }

   if (buffer.empty()) {
     buffer = m_BufferNoComment;
   }

  size_t pos = buffer.find("class",position);

  std::string nameOfClass = "";
  while(pos!=std::string::npos)
    {
    if(!this->IsBetweenCharsFast('<','>',pos,false,buffer))
      {
      bool valid = true;      
      // We check that the word class is alone
      if(pos>1)
        {
        if(buffer[pos-1] != ' ' && buffer[pos-1] != '/' && buffer[pos-1] != '\n')
          {
          valid = false;
          }
        }
      if(pos<buffer.size()-2)
        {
        if(buffer[pos+5] != ' ' && buffer[pos+5] != '/' && buffer[pos+5] != '\r')
          {
          valid = false;
          } 
        }
      
      size_t i = pos+4;
      // We should get a { before a ;
      size_t brac = buffer.find('{',pos);
      size_t sem = buffer.find(';',pos);

      if(sem<=brac)
        {
        valid = false;
        }
      else
        {
        while((buffer[i] != '{')
          && (i<buffer.size())
          )
          {
          if(buffer[i] == ';')
            {
            valid = false;
            break;
            }
          else if(buffer[i] == ':')
            {
            break;
            }
          i++;
          }
        }
      
      if(valid)
        {
        return i;
        }
      }
    pos = buffer.find("class",pos+1);
    }

  return std::string::npos;
}